

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

void __thiscall RegressionTree::~RegressionTree(RegressionTree *this)

{
  void *in_RDI;
  RegressionTree *unaff_retaddr;
  
  ~RegressionTree(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

RegressionTree::~RegressionTree()
{
    delete[] _queryRootIndex;
    delete[] _numOfCandidates;
    delete[] _complementFunction;
}